

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Walk.cpp
# Opt level: O0

void __thiscall
Handlers::walk_common
          (Handlers *this,Character *character,PacketReader *reader,offset_in_Character_to_subr f)

{
  long lVar1;
  bool bVar2;
  uint ts;
  int iVar3;
  mapped_type *this_00;
  PacketReader *local_e8;
  undefined1 local_b0 [8];
  PacketBuilder builder;
  allocator<char> local_69;
  key_type local_68;
  int local_48;
  Handlers local_42;
  Handlers local_41;
  WalkResult walk_result;
  uchar y;
  uchar x;
  Timestamp timestamp;
  Direction direction;
  offset_in_Character_to_subr f_local;
  PacketReader *reader_local;
  Character *character_local;
  
  _timestamp = reader;
  x = PacketReader::GetChar((PacketReader *)character);
  ts = PacketReader::GetThree((PacketReader *)character);
  Timestamp::Timestamp((Timestamp *)&walk_result,ts);
  local_41 = (Handlers)PacketReader::GetChar((PacketReader *)character);
  local_42 = (Handlers)PacketReader::GetChar((PacketReader *)character);
  local_48 = 0;
  lVar1 = *(long *)(this + 0x410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"EnforceTimestamps",&local_69);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          *)(lVar1 + 0x198),&local_68);
  bVar2 = util::variant::operator_cast_to_bool(this_00);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar2) {
    builder.add_size._0_4_ = *(int *)(this + 0x230);
    iVar3 = Timestamp::operator-((Timestamp *)&walk_result,builder.add_size._0_4_);
    if (iVar3 < 0x24) {
      return;
    }
  }
  *(WalkResult *)(this + 0x230) = walk_result;
  if (this[0x114] == (Handlers)0x0) {
    if (x < 4) {
      *(undefined8 *)(this + 0x1d0) = 0;
      *(undefined4 *)(this + 0x1d8) = 0;
      *(undefined8 *)(this + 0x1e0) = 0;
      this[0x1e8] = (Handlers)0x0;
      if (((byte)this[0x18c] & 1) != 0) {
        PacketBuilder::PacketBuilder((PacketBuilder *)local_b0,PACKET_TRADE,PACKET_CLOSE,2);
        iVar3 = Character::PlayerID((Character *)this);
        PacketBuilder::AddShort((PacketBuilder *)local_b0,iVar3);
        Character::Send(*(Character **)(this + 400),(PacketBuilder *)local_b0);
        this[0x18c] = (Handlers)0x0;
        std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                  ((list<Character_Item,_std::allocator<Character_Item>_> *)(this + 0x1a0));
        this[0x198] = (Handlers)0x0;
        *(undefined1 *)(*(long *)(this + 400) + 0x18c) = 0;
        std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::clear
                  ((list<Character_Item,_std::allocator<Character_Item>_> *)
                   (*(long *)(this + 400) + 0x1a0));
        this[0x198] = (Handlers)0x0;
        Character::CheckQuestRules((Character *)this);
        Character::CheckQuestRules(*(Character **)(this + 400));
        *(undefined8 *)(*(long *)(this + 400) + 400) = 0;
        *(undefined8 *)(this + 400) = 0;
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_b0);
      }
      if (((ulong)_timestamp & 1) == 0) {
        local_e8 = _timestamp;
      }
      else {
        local_e8 = *(PacketReader **)((long)_timestamp + *(long *)(this + f) + -1);
      }
      local_48 = (*(code *)local_e8)(this + f,x);
    }
    if ((local_48 == 0) ||
       ((local_48 == 1 && ((this[0xc0] != local_41 || (this[0xc1] != local_42)))))) {
      Character::Refresh((Character *)this);
    }
  }
  return;
}

Assistant:

static void walk_common(Character *character, PacketReader &reader, Map::WalkResult (Character::*f)(Direction))
{
	Direction direction = static_cast<Direction>(reader.GetChar());
	Timestamp timestamp = reader.GetThree();
	unsigned char x = reader.GetChar();
	unsigned char y = reader.GetChar();
	Map::WalkResult walk_result = Map::WalkFail;

	if (character->world->config["EnforceTimestamps"])
	{
		if (timestamp - character->timestamp < 36)
		{
			return;
		}
	}

	character->timestamp = timestamp;

	if (character->sitting != SIT_STAND)
	{
		return;
	}

	if (direction <= 3)
	{
		character->npc = 0;
		character->npc_type = ENF::NPC;
		character->board = 0;
		character->jukebox_open = false;

		if (character->trading)
		{
			PacketBuilder builder(PACKET_TRADE, PACKET_CLOSE, 2);
			builder.AddShort(character->PlayerID());
			character->trade_partner->Send(builder);

			character->trading = false;
			character->trade_inventory.clear();
			character->trade_agree = false;

			character->trade_partner->trading = false;
			character->trade_partner->trade_inventory.clear();
			character->trade_agree = false;

			character->CheckQuestRules();
			character->trade_partner->CheckQuestRules();

			character->trade_partner->trade_partner = 0;
			character->trade_partner = 0;
		}

		walk_result = (character->*f)(direction);
	}

	if (walk_result == Map::WalkFail || (walk_result == Map::WalkOK && (character->x != x || character->y != y)))
	{
		character->Refresh();
	}
}